

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_info.cc
# Opt level: O0

void __thiscall pstack::Dwarf::Info::Info(Info *this,sptr *obj)

{
  element_type *peVar1;
  Section *pSVar2;
  allocator<char> local_139;
  string local_138;
  allocator<char> local_111;
  string local_110;
  allocator<char> local_e9;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  sptr *local_18;
  sptr *obj_local;
  Info *this_local;
  
  local_18 = obj;
  obj_local = (sptr *)this;
  std::enable_shared_from_this<pstack::Dwarf::Info>::enable_shared_from_this
            (&this->super_enable_shared_from_this<pstack::Dwarf::Info>);
  std::shared_ptr<pstack::Elf::Object>::shared_ptr(&this->elf,obj);
  std::
  map<unsigned_long,_pstack::Dwarf::CallFrame,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_pstack::Dwarf::CallFrame>_>_>
  ::map(&this->callFrameForAddr);
  peVar1 = std::__shared_ptr_access<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->elf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,".debug_info",&local_39);
  pSVar2 = Elf::Object::getDebugSection(peVar1,&local_38,0);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  this->debugInfo = pSVar2;
  peVar1 = std::__shared_ptr_access<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->elf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,".debug_str",&local_71);
  pSVar2 = Elf::Object::getDebugSection(peVar1,&local_70,0);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  this->debugStrings = pSVar2;
  peVar1 = std::__shared_ptr_access<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->elf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,".debug_line_str",&local_99);
  pSVar2 = Elf::Object::getDebugSection(peVar1,&local_98,0);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  this->debugLineStrings = pSVar2;
  peVar1 = std::__shared_ptr_access<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->elf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,".debug_ranges",&local_c1);
  pSVar2 = Elf::Object::getDebugSection(peVar1,&local_c0,0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  this->debugRanges = pSVar2;
  peVar1 = std::__shared_ptr_access<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->elf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,".debug_str_offsets",&local_e9);
  pSVar2 = Elf::Object::getDebugSection(peVar1,&local_e8,0);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  this->debugStrOffsets = pSVar2;
  peVar1 = std::__shared_ptr_access<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->elf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,".debug_addr",&local_111);
  pSVar2 = Elf::Object::getDebugSection(peVar1,&local_110,0);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  this->debugAddr = pSVar2;
  peVar1 = std::__shared_ptr_access<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->elf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,".debug_rnglists",&local_139);
  pSVar2 = Elf::Object::getDebugSection(peVar1,&local_138,0);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator(&local_139);
  this->debugRangelists = pSVar2;
  std::
  unique_ptr<std::__cxx11::list<pstack::Dwarf::PubnameUnit,std::allocator<pstack::Dwarf::PubnameUnit>>,std::default_delete<std::__cxx11::list<pstack::Dwarf::PubnameUnit,std::allocator<pstack::Dwarf::PubnameUnit>>>>
  ::
  unique_ptr<std::default_delete<std::__cxx11::list<pstack::Dwarf::PubnameUnit,std::allocator<pstack::Dwarf::PubnameUnit>>>,void>
            ((unique_ptr<std::__cxx11::list<pstack::Dwarf::PubnameUnit,std::allocator<pstack::Dwarf::PubnameUnit>>,std::default_delete<std::__cxx11::list<pstack::Dwarf::PubnameUnit,std::allocator<pstack::Dwarf::PubnameUnit>>>>
              *)&this->pubnameUnits,(nullptr_t)0x0);
  std::
  map<unsigned_long,_std::shared_ptr<pstack::Dwarf::Unit>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<pstack::Dwarf::Unit>_>_>_>
  ::map(&this->units);
  std::shared_ptr<pstack::Dwarf::Info>::shared_ptr(&this->altDwarf);
  std::
  unique_ptr<std::map<unsigned_long,std::pair<unsigned_long,unsigned_long>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>>>,std::default_delete<std::map<unsigned_long,std::pair<unsigned_long,unsigned_long>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>>>>>
  ::
  unique_ptr<std::default_delete<std::map<unsigned_long,std::pair<unsigned_long,unsigned_long>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>>>>,void>
            ((unique_ptr<std::map<unsigned_long,std::pair<unsigned_long,unsigned_long>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>>>,std::default_delete<std::map<unsigned_long,std::pair<unsigned_long,unsigned_long>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>>>>>
              *)&this->aranges);
  std::unique_ptr<pstack::Dwarf::Macros,std::default_delete<pstack::Dwarf::Macros>>::
  unique_ptr<std::default_delete<pstack::Dwarf::Macros>,void>
            ((unique_ptr<pstack::Dwarf::Macros,std::default_delete<pstack::Dwarf::Macros>> *)
             &this->macros);
  std::
  map<pstack::Dwarf::FIType,_std::unique_ptr<pstack::Dwarf::CFI,_std::default_delete<pstack::Dwarf::CFI>_>,_std::less<pstack::Dwarf::FIType>,_std::allocator<std::pair<const_pstack::Dwarf::FIType,_std::unique_ptr<pstack::Dwarf::CFI,_std::default_delete<pstack::Dwarf::CFI>_>_>_>_>
  ::map(&this->cfi);
  this->altImageLoaded = false;
  this->unitRangesCached = false;
  return;
}

Assistant:

Info::Info(Elf::Object::sptr obj)
    : elf(std::move(obj))
    , debugInfo(elf->getDebugSection(".debug_info", SHT_NULL))
    , debugStrings(elf->getDebugSection(".debug_str", SHT_NULL))
    , debugLineStrings(elf->getDebugSection(".debug_line_str", SHT_NULL))
    , debugRanges(elf->getDebugSection(".debug_ranges", SHT_NULL))
    , debugStrOffsets(elf->getDebugSection(".debug_str_offsets", SHT_NULL))
    , debugAddr(elf->getDebugSection(".debug_addr", SHT_NULL))
    , debugRangelists(elf->getDebugSection(".debug_rnglists", SHT_NULL))
{
}